

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

int ftp_pl_get_permission(char *str)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0x100;
  if (*str != 'r') {
    uVar2 = (uint)(*str != '-') << 0x18;
  }
  if (str[1] != '-') {
    if (str[1] == 'w') {
      uVar2 = uVar2 | 0x80;
    }
    else {
      uVar2 = uVar2 | 0x1000000;
    }
  }
  bVar1 = str[2];
  if (bVar1 < 0x73) {
    if (bVar1 != 0x2d) {
      if (bVar1 == 0x53) {
        uVar2 = uVar2 | 0x800;
      }
      else {
LAB_0012739f:
        uVar2 = uVar2 | 0x1000000;
      }
    }
  }
  else if (bVar1 == 0x73) {
    uVar2 = uVar2 | 0x840;
  }
  else {
    if (bVar1 != 0x78) goto LAB_0012739f;
    uVar2 = uVar2 | 0x40;
  }
  if (str[3] != '-') {
    if (str[3] == 'r') {
      uVar2 = uVar2 | 0x20;
    }
    else {
      uVar2 = uVar2 | 0x1000000;
    }
  }
  if (str[4] != '-') {
    if (str[4] == 'w') {
      uVar2 = uVar2 | 0x10;
    }
    else {
      uVar2 = uVar2 | 0x1000000;
    }
  }
  bVar1 = str[5];
  if (bVar1 < 0x73) {
    if (bVar1 == 0x2d) goto LAB_00127410;
    if (bVar1 == 0x53) {
      uVar2 = uVar2 | 0x400;
      goto LAB_00127410;
    }
  }
  else {
    if (bVar1 == 0x73) {
      uVar2 = uVar2 | 0x408;
      goto LAB_00127410;
    }
    if (bVar1 == 0x78) {
      uVar2 = uVar2 | 8;
      goto LAB_00127410;
    }
  }
  uVar2 = uVar2 | 0x1000000;
LAB_00127410:
  if (str[6] != '-') {
    if (str[6] == 'r') {
      uVar2 = uVar2 | 4;
    }
    else {
      uVar2 = uVar2 | 0x1000000;
    }
  }
  if (str[7] != '-') {
    if (str[7] == 'w') {
      uVar2 = uVar2 | 2;
    }
    else {
      uVar2 = uVar2 | 0x1000000;
    }
  }
  bVar1 = str[8];
  if (bVar1 < 0x74) {
    if (bVar1 == 0x2d) {
      return uVar2;
    }
    if (bVar1 == 0x54) {
      return uVar2 | 0x200;
    }
  }
  else {
    if (bVar1 == 0x74) {
      return uVar2 | 0x201;
    }
    if (bVar1 == 0x78) {
      return uVar2 | 1;
    }
  }
  return uVar2 | 0x1000000;
}

Assistant:

static int ftp_pl_get_permission(const char *str)
{
  int permissions = 0;
  /* USER */
  if(str[0] == 'r')
    permissions |= 1 << 8;
  else if(str[0] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[1] == 'w')
    permissions |= 1 << 7;
  else if(str[1] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;

  if(str[2] == 'x')
    permissions |= 1 << 6;
  else if(str[2] == 's') {
    permissions |= 1 << 6;
    permissions |= 1 << 11;
  }
  else if(str[2] == 'S')
    permissions |= 1 << 11;
  else if(str[2] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  /* GROUP */
  if(str[3] == 'r')
    permissions |= 1 << 5;
  else if(str[3] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[4] == 'w')
    permissions |= 1 << 4;
  else if(str[4] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[5] == 'x')
    permissions |= 1 << 3;
  else if(str[5] == 's') {
    permissions |= 1 << 3;
    permissions |= 1 << 10;
  }
  else if(str[5] == 'S')
    permissions |= 1 << 10;
  else if(str[5] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  /* others */
  if(str[6] == 'r')
    permissions |= 1 << 2;
  else if(str[6] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[7] == 'w')
    permissions |= 1 << 1;
  else if(str[7] != '-')
      permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[8] == 'x')
    permissions |= 1;
  else if(str[8] == 't') {
    permissions |= 1;
    permissions |= 1 << 9;
  }
  else if(str[8] == 'T')
    permissions |= 1 << 9;
  else if(str[8] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;

  return permissions;
}